

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

void llama_batch_free(llama_batch batch)

{
  void *in_stack_00000010;
  int i;
  void *in_stack_00000018;
  int local_4;
  
  if (in_stack_00000010 != (void *)0x0) {
    free(in_stack_00000010);
  }
  if (in_stack_00000018 != (void *)0x0) {
    free(in_stack_00000018);
  }
  if (batch._0_8_ != 0) {
    free((void *)batch._0_8_);
  }
  if (batch.token != (llama_token *)0x0) {
    free(batch.token);
  }
  if (batch.embd != (float *)0x0) {
    local_4 = 0;
    while (*(long *)(batch.embd + (long)local_4 * 2) != 0) {
      free(*(void **)(batch.embd + (long)local_4 * 2));
      local_4 = local_4 + 1;
    }
    free(batch.embd);
  }
  if (batch.pos != (llama_pos *)0x0) {
    free(batch.pos);
  }
  return;
}

Assistant:

void llama_batch_free(struct llama_batch batch) {
    if (batch.token)    free(batch.token);
    if (batch.embd)     free(batch.embd);
    if (batch.pos)      free(batch.pos);
    if (batch.n_seq_id) free(batch.n_seq_id);
    if (batch.seq_id) {
        for (int i = 0; batch.seq_id[i] != nullptr; ++i) {
            free(batch.seq_id[i]);
        }
        free(batch.seq_id);
    }
    if (batch.logits)   free(batch.logits);
}